

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationItem::IfcGeometricRepresentationItem
          (IfcGeometricRepresentationItem *this)

{
  IfcGeometricRepresentationItem *this_local;
  
  STEP::Object::Object
            ((Object *)
             &(this->super_IfcRepresentationItem).
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20,
             "IfcGeometricRepresentationItem");
  IfcRepresentationItem::IfcRepresentationItem
            (&this->super_IfcRepresentationItem,&PTR_construction_vtable_24__00f4d418);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationItem,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationItem,_0UL> *)
             &(this->super_IfcRepresentationItem).
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10,
             &PTR_construction_vtable_24__00f4d438);
  (this->super_IfcRepresentationItem).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf4d3b0;
  *(undefined8 *)
   &(this->super_IfcRepresentationItem).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf4d400;
  *(undefined8 *)
   &(this->super_IfcRepresentationItem).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf4d3d8;
  return;
}

Assistant:

IfcGeometricRepresentationItem() : Object("IfcGeometricRepresentationItem") {}